

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O1

void __thiscall
duckdb_re2::SparseArray<int>::SparseArray(SparseArray<int> *this,SparseArray<int> *src)

{
  int __n2;
  _Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter,_false>
  _Var1;
  int *piVar2;
  IndexValue *pIVar3;
  ulong uVar4;
  new_allocator<int> local_22;
  new_allocator<duckdb_re2::SparseArray<int>::IndexValue> local_21;
  
  this->size_ = src->size_;
  _Var1._M_head_impl.len_ = (Deleter)0;
  if ((src->dense_).ptr_._M_t.
      super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
      .super__Head_base<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl !=
      (IndexValue *)0x0) {
    _Var1._M_head_impl.len_ =
         (src->dense_).ptr_._M_t.
         super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
         .
         super__Tuple_impl<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
         .
         super__Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter,_false>
         ._M_head_impl;
  }
  piVar2 = __gnu_cxx::new_allocator<int>::allocate
                     (&local_22,(long)(int)_Var1._M_head_impl.len_,(void *)0x0);
  (this->sparse_).ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
  super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
  super__Tuple_impl<1UL,_duckdb_re2::PODArray<int>::Deleter>.
  super__Head_base<1UL,_duckdb_re2::PODArray<int>::Deleter,_false> =
       (_Head_base<1UL,_duckdb_re2::PODArray<int>::Deleter,_false>)_Var1._M_head_impl.len_;
  (this->sparse_).ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
  super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
  super__Head_base<0UL,_int_*,_false>._M_head_impl = piVar2;
  _Var1._M_head_impl.len_ = (Deleter)0;
  if ((src->dense_).ptr_._M_t.
      super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
      .super__Head_base<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl !=
      (IndexValue *)0x0) {
    _Var1._M_head_impl.len_ =
         (src->dense_).ptr_._M_t.
         super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
         .
         super__Tuple_impl<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
         .
         super__Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter,_false>
         ._M_head_impl;
  }
  pIVar3 = __gnu_cxx::new_allocator<duckdb_re2::SparseArray<int>::IndexValue>::allocate
                     (&local_21,(long)(int)_Var1._M_head_impl.len_,(void *)0x0);
  (this->dense_).ptr_._M_t.
  super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
  .super__Tuple_impl<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>.
  super__Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter,_false>
       = (_Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter,_false>
          )_Var1._M_head_impl.len_;
  (this->dense_).ptr_._M_t.
  super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
  .super__Head_base<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl = pIVar3;
  uVar4 = 0;
  if ((src->dense_).ptr_._M_t.
      super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
      .super__Head_base<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl !=
      (IndexValue *)0x0) {
    uVar4 = (ulong)(uint)(src->dense_).ptr_._M_t.
                         super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                         .
                         super__Tuple_impl<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                         .
                         super__Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter,_false>
    ;
  }
  if (0 < (int)uVar4) {
    memmove((this->sparse_).ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>
            ._M_t.super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl,
            (src->sparse_).ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>.
            _M_t.super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl,uVar4 << 2);
  }
  _Var1._M_head_impl.len_ = (Deleter)0;
  if ((src->dense_).ptr_._M_t.
      super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
      .super__Head_base<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl !=
      (IndexValue *)0x0) {
    _Var1._M_head_impl.len_ =
         (src->dense_).ptr_._M_t.
         super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
         .
         super__Tuple_impl<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
         .
         super__Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter,_false>
         ._M_head_impl;
  }
  if (0 < (int)_Var1._M_head_impl.len_) {
    memmove((this->dense_).ptr_._M_t.
            super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
            .super__Head_base<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl,
            (src->dense_).ptr_._M_t.
            super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
            .super__Head_base<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl,
            (ulong)(uint)_Var1._M_head_impl.len_ << 3);
  }
  return;
}

Assistant:

SparseArray<Value>::SparseArray(const SparseArray& src)
    : size_(src.size_),
      sparse_(src.max_size()),
      dense_(src.max_size()) {
  std::copy_n(src.sparse_.data(), src.max_size(), sparse_.data());
  std::copy_n(src.dense_.data(), src.max_size(), dense_.data());
}